

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseSeqId(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    iVar2 = (state->parse_state).mangled_idx;
    cVar5 = state->mangled_begin[iVar2];
    if (cVar5 != '\0') {
      lVar4 = 0;
      do {
        if (9 < (byte)(cVar5 - 0x30U) && 0x19 < (byte)(cVar5 + 0xbfU)) {
          if (lVar4 == 0) goto LAB_00346002;
          break;
        }
        cVar5 = state->mangled_begin[lVar4 + (long)iVar2 + 1];
        lVar4 = lVar4 + 1;
      } while (cVar5 != '\0');
      (state->parse_state).mangled_idx = (int)lVar4 + iVar2;
      bVar3 = true;
      goto LAB_00346004;
    }
  }
LAB_00346002:
  bVar3 = false;
LAB_00346004:
  state->recursion_depth = iVar1;
  return bVar3;
}

Assistant:

explicit ComplexityGuard(State *state) : state_(state) {
    ++state->recursion_depth;
    ++state->steps;
  }